

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool bool_exec(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_fiber_t *pgVar1;
  char local_2048 [8];
  char _buffer_1 [4096];
  gravity_value_t v;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if (nargs == 2) {
    join_0x00000010_0x00000000_ = convert_value2bool(vm,args[1]);
    if (_buffer_1._4088_8_ == 0) {
      snprintf(local_2048,0x1000,"Unable to convert object to Bool.");
      pgVar1 = gravity_vm_fiber(vm);
      gravity_fiber_seterror(pgVar1,local_2048);
      value.field_1.n = 0;
      value.isa = gravity_class_null;
      gravity_vm_setslot(vm,value,_buffer._4088_4_);
      vm_local._7_1_ = false;
    }
    else {
      gravity_vm_setslot(vm,join_0x00000010_0x00000000_,_buffer._4088_4_);
      vm_local._7_1_ = true;
    }
  }
  else {
    snprintf(local_1028,0x1000,"A single argument is expected in Bool casting.");
    pgVar1 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar1,local_1028);
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool bool_exec (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs != 2) RETURN_ERROR("A single argument is expected in Bool casting.");

    gravity_value_t v = convert_value2bool(vm, GET_VALUE(1));
    if (VALUE_ISA_NOTVALID(v)) RETURN_ERROR("Unable to convert object to Bool.");
    RETURN_VALUE(v, rindex);
}